

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_write_operators.hpp
# Opt level: O0

void duckdb::ParquetUUIDOperator::HandleStats<duckdb::hugeint_t,duckdb::ParquetUUIDTargetType>
               (ColumnWriterStatistics *stats_p,ParquetUUIDTargetType target_value)

{
  int iVar1;
  UUIDStatisticsState *pUVar2;
  undefined8 in_RDX;
  undefined8 in_RSI;
  UUIDStatisticsState *stats;
  ColumnWriterStatistics *in_stack_ffffffffffffffe0;
  undefined8 local_10;
  undefined8 local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDX;
  pUVar2 = ColumnWriterStatistics::Cast<duckdb::UUIDStatisticsState>(in_stack_ffffffffffffffe0);
  if ((pUVar2->has_stats & 1U) == 0) {
LAB_0060993a:
    *(undefined8 *)pUVar2->min = local_10;
    *(undefined8 *)(pUVar2->min + 8) = local_8;
  }
  else {
    iVar1 = memcmp(&local_10,pUVar2->min,0x10);
    if (iVar1 < 0) goto LAB_0060993a;
  }
  if ((pUVar2->has_stats & 1U) != 0) {
    iVar1 = memcmp(&local_10,pUVar2->max,0x10);
    if (iVar1 < 1) goto LAB_00609990;
  }
  *(undefined8 *)pUVar2->max = local_10;
  *(undefined8 *)(pUVar2->max + 8) = local_8;
LAB_00609990:
  pUVar2->has_stats = true;
  return;
}

Assistant:

static void HandleStats(ColumnWriterStatistics *stats_p, TGT target_value) {
		auto &stats = stats_p->Cast<UUIDStatisticsState>();
		if (!stats.has_stats || memcmp(target_value.bytes, stats.min, ParquetUUIDTargetType::PARQUET_UUID_SIZE) < 0) {
			memcpy(stats.min, target_value.bytes, ParquetUUIDTargetType::PARQUET_UUID_SIZE);
		}
		if (!stats.has_stats || memcmp(target_value.bytes, stats.max, ParquetUUIDTargetType::PARQUET_UUID_SIZE) > 0) {
			memcpy(stats.max, target_value.bytes, ParquetUUIDTargetType::PARQUET_UUID_SIZE);
		}
		stats.has_stats = true;
	}